

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextEditState::OnKeyPressed(ImGuiTextEditState *this,int key)

{
  int key_local;
  ImGuiTextEditState *this_local;
  
  ImGuiStb::stb_textedit_key(this,&this->StbState,key);
  this->CursorFollow = true;
  CursorAnimReset(this);
  return;
}

Assistant:

void ImGuiTextEditState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}